

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::_internal_add_strides
          (SliceDynamicLayerParams *this,int64_t value)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long tmp;
  
  this_00 = &this->strides_;
  uVar1 = (this->strides_).current_size_;
  uVar2 = (this->strides_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this_00,uVar2 + 1);
  }
  plVar3 = google::protobuf::RepeatedField<long>::elements(this_00);
  plVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void SliceDynamicLayerParams::_internal_add_strides(int64_t value) {
  strides_.Add(value);
}